

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

void ELFIO::dump::dynamic_tag
               (ostream *out,Elf_Xword no,Elf_Xword tag,Elf_Xword value,string *str,uint param_6)

{
  unsigned_long *key;
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  size_type sVar4;
  string local_58;
  Elf_Xword local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  lVar3 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 5;
  poVar2 = out + *(long *)(lVar3 + -0x18);
  if (out[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar3 = *(long *)out;
  }
  poVar2[0xe0] = (ostream)0x20;
  *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
  lVar3 = *(long *)poVar1;
  *(undefined8 *)(poVar1 + *(long *)(lVar3 + -0x18) + 0x10) = 0x10;
  poVar2 = poVar1 + *(long *)(lVar3 + -0x18);
  if (poVar1[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar3 = *(long *)poVar1;
  }
  poVar2[0xe0] = (ostream)0x20;
  key = *(unsigned_long **)(lVar3 + -0x18);
  *(uint *)(poVar1 + 0x18 + (long)key) = *(uint *)(poVar1 + 0x18 + (long)key) & 0xffffffb5 | 8;
  *(uint *)(poVar1 + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  local_38 = tag;
  format_assoc<ELFIO::dynamic_tag_t[55],unsigned_long>
            (&local_58,(dump *)dynamic_tag_table,(dynamic_tag_t (*) [55])&local_38,key);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  sVar4 = str->_M_string_length;
  if (sVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
    lVar3 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 0x10;
    poVar2 = out + *(long *)(lVar3 + -0x18);
    if (out[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar2);
      poVar2[0xe1] = (ostream)0x1;
      lVar3 = *(long *)out;
    }
    poVar2[0xe0] = (ostream)0x30;
    *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  else {
    lVar3 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 0x20;
    poVar2 = out + *(long *)(lVar3 + -0x18);
    if (out[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar2);
      poVar2[0xe1] = (ostream)0x1;
      lVar3 = *(long *)out;
      sVar4 = str->_M_string_length;
    }
    poVar2[0xe0] = (ostream)0x20;
    *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,(str->_M_dataplus)._M_p,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

static void dynamic_tag( std::ostream&      out,
                             Elf_Xword          no,
                             Elf_Xword          tag,
                             Elf_Xword          value,
                             const std::string& str,
                             unsigned int /*elf_class*/ )
    {
        out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
            << DUMP_STR_FORMAT( 16 ) << str_dynamic_tag( tag ) << " ";
        if ( str.empty() ) {
            out << DUMP_HEX0x_FORMAT( 16 ) << value << " ";
        }
        else {
            out << DUMP_STR_FORMAT( 32 ) << str << " ";
        }
        out << std::endl;
    }